

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

ON_BrepFace * __thiscall ON_Brep::NewFace(ON_Brep *this,int si)

{
  int iVar1;
  ON_BrepFace *pOVar2;
  long lVar3;
  uint uVar4;
  
  ON_BoundingBox::Destroy(&this->m_bbox);
  this->m_is_solid = 0;
  iVar1 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count;
  lVar3 = (long)iVar1;
  uVar4 = (uint)(lVar3 + 1U);
  if ((uint)(this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
            m_capacity < uVar4) {
    ON_ClassArray<ON_BrepFace>::SetCapacity((ON_ClassArray<ON_BrepFace> *)&this->m_F,lVar3 + 1U);
  }
  if ((-2 < iVar1) &&
     (iVar1 < (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
              m_capacity)) {
    (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count = uVar4;
  }
  pOVar2 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
  pOVar2[lVar3].m_face_index = iVar1;
  pOVar2[lVar3].m_si = si;
  pOVar2[lVar3].m_brep = this;
  if ((-1 < si) && (si < (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count)) {
    ON_SurfaceProxy::SetProxySurface
              (&pOVar2[lVar3].super_ON_SurfaceProxy,
               (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[(uint)si]);
  }
  return pOVar2 + lVar3;
}

Assistant:

ON_BrepFace& ON_Brep::NewFace( int si )
{
  m_bbox.Destroy();
  // GBA 28-MAy-2020 RH-58462.  m_bbox is now left unset after this function
  // This works since ON_BrepFace::BoundingBox() supports lazy evaluation 
  m_is_solid = 0;
  int fi = m_F.Count();
  m_F.Reserve(fi+1);
  m_F.SetCount(fi+1);
  ON_BrepFace& face = m_F.Array()[fi];
  face.m_face_index = fi;
  face.m_si = si;
  face.m_brep = this;
  if ( si >= 0 && si < m_S.Count() )
    face.SetProxySurface(m_S[si]);
  
  return face;
}